

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O1

PropertyID lunasvg::propertyid(string_view *name)

{
  ulong uVar1;
  char *__s2;
  size_t __n;
  PropertyID PVar2;
  int iVar3;
  ulong __n_00;
  anon_struct_24_2_b8fd76e8 *paVar4;
  difference_type __d;
  ulong uVar5;
  long lVar7;
  ulong uVar6;
  
  uVar1 = name->_M_len;
  __s2 = name->_M_str;
  paVar4 = propertyid::table;
  uVar6 = 0x2f;
  do {
    uVar5 = uVar6 >> 1;
    __n_00 = paVar4[uVar5].name._M_len;
    lVar7 = __n_00 - uVar1;
    if (uVar1 <= __n_00) {
      __n_00 = uVar1;
    }
    if (__n_00 == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = memcmp(paVar4[uVar5].name._M_str,__s2,__n_00);
    }
    if (iVar3 == 0) {
      if (lVar7 < -0x7fffffff) {
        lVar7 = -0x80000000;
      }
      if (0x7ffffffe < lVar7) {
        lVar7 = 0x7fffffff;
      }
      iVar3 = (int)lVar7;
    }
    if (iVar3 < 0) {
      paVar4 = paVar4 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar6;
    }
    uVar6 = uVar5;
  } while (0 < (long)uVar5);
  if ((paVar4 != (anon_struct_24_2_b8fd76e8 *)&DAT_0015a968) &&
     (__n = (paVar4->name)._M_len, __n == uVar1)) {
    if (__n != 0) {
      iVar3 = bcmp((paVar4->name)._M_str,__s2,__n);
      if (iVar3 != 0) goto LAB_0011f31d;
    }
    return paVar4->value;
  }
LAB_0011f31d:
  PVar2 = csspropertyid(name);
  return PVar2;
}

Assistant:

PropertyID propertyid(const std::string_view& name)
{
    static const struct {
        std::string_view name;
        PropertyID value;
    } table[] = {
        {"class", PropertyID::Class},
        {"clipPathUnits", PropertyID::ClipPathUnits},
        {"cx", PropertyID::Cx},
        {"cy", PropertyID::Cy},
        {"d", PropertyID::D},
        {"dx", PropertyID::Dx},
        {"dy", PropertyID::Dy},
        {"fx", PropertyID::Fx},
        {"fy", PropertyID::Fy},
        {"gradientTransform", PropertyID::GradientTransform},
        {"gradientUnits", PropertyID::GradientUnits},
        {"height", PropertyID::Height},
        {"href", PropertyID::Href},
        {"id", PropertyID::Id},
        {"lengthAdjust", PropertyID::LengthAdjust},
        {"markerHeight", PropertyID::MarkerHeight},
        {"markerUnits", PropertyID::MarkerUnits},
        {"markerWidth", PropertyID::MarkerWidth},
        {"maskContentUnits", PropertyID::MaskContentUnits},
        {"maskUnits", PropertyID::MaskUnits},
        {"offset", PropertyID::Offset},
        {"orient", PropertyID::Orient},
        {"patternContentUnits", PropertyID::PatternContentUnits},
        {"patternTransform", PropertyID::PatternTransform},
        {"patternUnits", PropertyID::PatternUnits},
        {"points", PropertyID::Points},
        {"preserveAspectRatio", PropertyID::PreserveAspectRatio},
        {"r", PropertyID::R},
        {"refX", PropertyID::RefX},
        {"refY", PropertyID::RefY},
        {"rotate", PropertyID::Rotate},
        {"rx", PropertyID::Rx},
        {"ry", PropertyID::Ry},
        {"spreadMethod", PropertyID::SpreadMethod},
        {"style", PropertyID::Style},
        {"textLength", PropertyID::TextLength},
        {"transform", PropertyID::Transform},
        {"viewBox", PropertyID::ViewBox},
        {"width", PropertyID::Width},
        {"x", PropertyID::X},
        {"x1", PropertyID::X1},
        {"x2", PropertyID::X2},
        {"xlink:href", PropertyID::Href},
        {"xml:space", PropertyID::WhiteSpace},
        {"y", PropertyID::Y},
        {"y1", PropertyID::Y1},
        {"y2", PropertyID::Y2}
    };

    auto it = std::lower_bound(table, std::end(table), name, [](const auto& item, const auto& name) { return item.name < name; });
    if(it == std::end(table) || it->name != name)
        return csspropertyid(name);
    return it->value;
}